

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cc
# Opt level: O0

void __thiscall
absl::lts_20240722::flags_internal::anon_unknown_6::RetiredFlagObj::OnAccess(RetiredFlagObj *this)

{
  AlphaNum local_d0;
  AlphaNum local_a0;
  AlphaNum local_70;
  undefined1 local_40 [48];
  RetiredFlagObj *local_10;
  RetiredFlagObj *this_local;
  
  local_10 = this;
  AlphaNum::AlphaNum(&local_70,"Accessing retired flag \'");
  AlphaNum::AlphaNum(&local_a0,this->name_);
  AlphaNum::AlphaNum(&local_d0,"\'");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_40,&local_70,&local_a0);
  local_40._32_16_ = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
  absl::lts_20240722::flags_internal::ReportUsageError(local_40._32_8_,local_40._40_8_,0);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void OnAccess() const {
    flags_internal::ReportUsageError(
        absl::StrCat("Accessing retired flag '", name_, "'"), false);
  }